

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWSImporter::SetupProperties(LWSImporter *this,Importer *pImp)

{
  int iVar1;
  double __tmp;
  double dVar2;
  
  iVar1 = Importer::GetPropertyInteger(pImp,"FAVOUR_SPEED",0);
  this->configSpeedFlag = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_LWS_ANIM_START",0x24b78);
  this->first = (double)iVar1;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_LWS_ANIM_END",0x24b78);
  dVar2 = (double)iVar1;
  this->last = dVar2;
  if (dVar2 < this->first) {
    this->last = this->first;
    this->first = dVar2;
  }
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_NO_SKELETON_MESHES",0);
  this->noSkeletonMesh = iVar1 != 0;
  return;
}

Assistant:

void LWSImporter::SetupProperties(const Importer* pImp)
{
    // AI_CONFIG_FAVOUR_SPEED
    configSpeedFlag = (0 != pImp->GetPropertyInteger(AI_CONFIG_FAVOUR_SPEED,0));

    // AI_CONFIG_IMPORT_LWS_ANIM_START
    first = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_LWS_ANIM_START,
        150392 /* magic hack */);

    // AI_CONFIG_IMPORT_LWS_ANIM_END
    last = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_LWS_ANIM_END,
        150392 /* magic hack */);

    if (last < first) {
        std::swap(last,first);
    }

    noSkeletonMesh = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_NO_SKELETON_MESHES,0) != 0;
}